

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O2

int abuf_memcpy(autobuf *autobuf,void *p,size_t len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = 0;
  if (len != 0 && autobuf != (autobuf *)0x0) {
    iVar1 = _autobuf_enlarge(autobuf,autobuf->_len + len);
    if (iVar1 < 0) {
      iVar2 = -1;
    }
    else {
      memcpy(autobuf->_buf + autobuf->_len,p,len);
      sVar3 = len + autobuf->_len;
      autobuf->_len = sVar3;
      autobuf->_buf[sVar3] = '\0';
    }
  }
  return iVar2;
}

Assistant:

int
abuf_memcpy(struct autobuf *autobuf, const void *p, const size_t len) {
  if (autobuf == NULL || len == 0)
    return 0;

  if (_autobuf_enlarge(autobuf, autobuf->_len + len) < 0) {
    return -1;
  }
  memcpy(autobuf->_buf + autobuf->_len, p, len);
  autobuf->_len += len;

  /* null-terminate autobuf */
  autobuf->_buf[autobuf->_len] = 0;

  return 0;
}